

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

int skip_nearest_near_mv_using_refmv_weight
              (MACROBLOCK *x,PREDICTION_MODE this_mode,int8_t ref_frame_type,
              PREDICTION_MODE best_mode)

{
  byte bVar1;
  uint16_t (*pauVar2) [4];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  
  uVar4 = 0;
  uVar3 = 0;
  if (((0xf3 < (byte)(best_mode - 0x19) && 0xfd < (byte)(this_mode - 0xf)) &&
      (uVar3 = uVar4, (x->e_mbd).left_available == true)) && ((x->e_mbd).up_available == true)) {
    bVar1 = (x->mbmi_ext).ref_mv_count[ref_frame_type];
    bVar6 = 3;
    if (bVar1 < 3) {
      bVar6 = bVar1;
    }
    if ((bVar1 != 0) &&
       ((pauVar2 = (x->mbmi_ext).weight + ref_frame_type, this_mode != '\r' ||
        ((*pauVar2)[0] < 0x280)))) {
      uVar3 = 1;
      if (1 < bVar6) {
        uVar3 = (uint)bVar6;
      }
      uVar5 = 0;
      uVar4 = 0;
      do {
        uVar4 = (uVar4 + 1) - (uint)((*pauVar2)[uVar5] < 0x280);
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
      uVar3 = (uint)(uVar4 < (bVar1 != 1) + 1);
    }
  }
  return uVar3;
}

Assistant:

static inline int skip_nearest_near_mv_using_refmv_weight(
    const MACROBLOCK *const x, const PREDICTION_MODE this_mode,
    const int8_t ref_frame_type, PREDICTION_MODE best_mode) {
  if (this_mode != NEARESTMV && this_mode != NEARMV) return 0;
  // Do not skip the mode if the current block has not yet obtained a valid
  // inter mode.
  if (!is_inter_mode(best_mode)) return 0;

  const MACROBLOCKD *xd = &x->e_mbd;
  // Do not skip the mode if both the top and left neighboring blocks are not
  // available.
  if (!xd->left_available || !xd->up_available) return 0;
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const uint16_t *const ref_mv_weight = mbmi_ext->weight[ref_frame_type];
  const int ref_mv_count =
      AOMMIN(MAX_REF_MV_SEARCH, mbmi_ext->ref_mv_count[ref_frame_type]);

  if (ref_mv_count == 0) return 0;
  // If ref mv list has at least one nearest candidate do not prune NEARESTMV
  if (this_mode == NEARESTMV && ref_mv_weight[0] >= REF_CAT_LEVEL) return 0;

  // Count number of ref mvs populated from nearest candidates
  int nearest_refmv_count = 0;
  for (int ref_mv_idx = 0; ref_mv_idx < ref_mv_count; ref_mv_idx++) {
    if (ref_mv_weight[ref_mv_idx] >= REF_CAT_LEVEL) nearest_refmv_count++;
  }

  // nearest_refmv_count indicates the closeness of block motion characteristics
  // with respect to its spatial neighbor. Smaller value of nearest_refmv_count
  // w.r.t to ref_mv_count means less correlation with its spatial neighbors.
  // Hence less possibility for NEARESTMV and NEARMV modes becoming the best
  // mode since these modes work well for blocks that shares similar motion
  // characteristics with its neighbor. Thus, NEARMV mode is pruned when
  // nearest_refmv_count is relatively smaller than ref_mv_count and NEARESTMV
  // mode is pruned if none of the ref mvs are populated from nearest candidate.
  const int prune_thresh = 1 + (ref_mv_count >= 2);
  if (nearest_refmv_count < prune_thresh) return 1;
  return 0;
}